

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void absl::lts_20250127::base_internal::LowLevelAlloc::Free(void *v)

{
  Arena *arena;
  ArenaLock section;
  
  if (v != (void *)0x0) {
    arena = *(Arena **)((long)v + -0x10);
    anon_unknown_0::ArenaLock::ArenaLock(&section,arena);
    AddToFreelist(v,arena);
    if (arena->allocation_count < 1) {
      raw_log_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x203,"Check %s failed: %s",
                 "arena->allocation_count > 0","nothing in arena to free");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                    ,0x203,"static void absl::base_internal::LowLevelAlloc::Free(void *)");
    }
    arena->allocation_count = arena->allocation_count + -1;
    anon_unknown_0::ArenaLock::Leave(&section);
    anon_unknown_0::ArenaLock::~ArenaLock(&section);
  }
  return;
}

Assistant:

void LowLevelAlloc::Free(void *v) {
  if (v != nullptr) {
    AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                                 sizeof(f->header));
    LowLevelAlloc::Arena *arena = f->header.arena;
    ArenaLock section(arena);
    AddToFreelist(v, arena);
    ABSL_RAW_CHECK(arena->allocation_count > 0, "nothing in arena to free");
    arena->allocation_count--;
    section.Leave();
  }
}